

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

double measure_solver_timing<int(*)(boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&),int>
                 (_func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
                  **solving_function,
                 matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                 *cost_matrix)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> assignment;
  undefined1 local_48 [16];
  pointer local_38;
  DurationFormatter local_30;
  DurationFormatter local_28;
  
  local_48 = (undefined1  [16])0x0;
  local_38 = (pointer)0x0;
  lVar2 = boost::chrono::steady_clock::now();
  (**solving_function)
            (cost_matrix,cost_matrix->size1_,cost_matrix->size2_,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  lVar3 = boost::chrono::steady_clock::now();
  uVar4 = cost_matrix->size2_;
  if (cost_matrix->size2_ < cost_matrix->size1_) {
    uVar4 = cost_matrix->size1_;
  }
  dVar9 = 1.0;
  if (uVar4 != 0) {
    uVar6 = 1;
    do {
      auVar8._8_4_ = (int)(uVar6 >> 0x20);
      auVar8._0_8_ = uVar6;
      auVar8._12_4_ = 0x45300000;
      dVar9 = dVar9 * ((auVar8._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
      uVar6 = uVar6 + 1;
    } while (uVar6 <= uVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Time to solve ",0x10);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"x",1);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," assignment problem (",0x15);
  lVar1 = *(long *)poVar5;
  *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb;
  *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 8) = 8;
  poVar5 = std::ostream::_M_insert<double>(dVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," combinations): ",0x10);
  dVar7 = (double)(lVar3 - lVar2) / 1000000000.0;
  local_28.d_ = dVar7;
  poVar5 = operator<<(poVar5,&local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  local_30.d_ = dVar7 / dVar9;
  poVar5 = operator<<(poVar5,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," per combination)",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_48._0_8_);
  }
  return dVar7;
}

Assistant:

double measure_solver_timing(const SolvingFunction& solving_function, const ublas::matrix<Cost>& cost_matrix)
{
  typedef boost::chrono::high_resolution_clock Clock;
  std::vector<std::size_t> assignment;
  const Clock::time_point start_time(Clock::now());
  solving_function(cost_matrix, cost_matrix.size1(), cost_matrix.size2(), assignment);
  const boost::chrono::duration<double> dt(Clock::now() - start_time);

  // Compute number of combinations = factorial of larger dimension of matrix:
  double c = 1;  // size_t gets too small fast
  for (std::size_t row = 1; row <= std::max(cost_matrix.size1(), cost_matrix.size2()); ++row)
  {
    c *= row;
  }

  std::cout << "  Time to solve " << cost_matrix.size1() << "x" << cost_matrix.size2() << " assignment problem ("
            << std::resetiosflags(std::ios::floatfield) << std::setprecision(8) << c << " combinations): "
            << DurationFormatter(dt.count()) << " (" << DurationFormatter(dt.count() / c) << " per combination)"
            << std::endl;
  return dt.count();
}